

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItem::setGraphicsEffect(QGraphicsItem *this,QGraphicsEffect *effect)

{
  QGraphicsEffect *pQVar1;
  long lVar2;
  QGraphicsItem *pQVar3;
  QGraphicsItemEffectSourcePrivate *this_00;
  QGraphicsEffectSource *this_01;
  QGraphicsItemPrivate *pQVar4;
  undefined4 uVar5;
  
  pQVar4 = (this->d_ptr).d;
  pQVar1 = pQVar4->graphicsEffect;
  if (pQVar1 != effect) {
    if (pQVar1 == (QGraphicsEffect *)0x0) {
      pQVar3 = pQVar4->parent;
      if (pQVar3 != (QGraphicsItem *)0x0) {
        pQVar4 = (pQVar3->d_ptr).d;
        while ((*(uint *)&pQVar4->field_0x168 >> 9 & 1) == 0) {
          *(uint *)&pQVar4->field_0x168 = *(uint *)&pQVar4->field_0x168 | 0x200;
          if ((pQVar4->parent == (QGraphicsItem *)0x0) ||
             (pQVar4 = (pQVar4->parent->d_ptr).d, pQVar4 == (QGraphicsItemPrivate *)0x0)) break;
        }
      }
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x20))();
      ((this->d_ptr).d)->graphicsEffect = (QGraphicsEffect *)0x0;
    }
    if (effect != (QGraphicsEffect *)0x0) {
      this_00 = (QGraphicsItemEffectSourcePrivate *)operator_new(0xf0);
      QGraphicsItemEffectSourcePrivate::QGraphicsItemEffectSourcePrivate(this_00,this);
      this_01 = (QGraphicsEffectSource *)operator_new(0x10);
      QGraphicsEffectSource::QGraphicsEffectSource
                (this_01,(QGraphicsEffectSourcePrivate *)this_00,(QObject *)0x0);
      ((this->d_ptr).d)->graphicsEffect = effect;
      lVar2 = *(long *)&effect->field_0x8;
      if (*(long *)(lVar2 + 0x78) == 0) {
        uVar5 = 1;
      }
      else {
        (**(code **)(**(long **)(*(long *)(lVar2 + 0x78) + 8) + 0x70))();
        QGraphicsEffectSourcePrivate::invalidateCache
                  (*(QGraphicsEffectSourcePrivate **)(*(long *)(lVar2 + 0x78) + 8),SourceChanged);
        (**(code **)(**(long **)(*(long *)(lVar2 + 0x78) + 8) + 0x20))();
        uVar5 = 3;
        if (*(long **)(lVar2 + 0x78) != (long *)0x0) {
          (**(code **)(**(long **)(lVar2 + 0x78) + 0x20))();
        }
      }
      *(QGraphicsEffectSource **)(lVar2 + 0x78) = this_01;
      (**(code **)(**(long **)(lVar2 + 8) + 0x70))(*(long **)(lVar2 + 8),uVar5);
      prepareGeometryChange(this);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsItem::setGraphicsEffect(QGraphicsEffect *effect)
{
    if (d_ptr->graphicsEffect == effect)
        return;

    if (d_ptr->graphicsEffect) {
        delete d_ptr->graphicsEffect;
        d_ptr->graphicsEffect = nullptr;
    } else if (d_ptr->parent) {
        d_ptr->parent->d_ptr->updateChildWithGraphicsEffectFlagRecursively();
    }

    if (effect) {
        // Set new effect.
        QGraphicsEffectSourcePrivate *sourced = new QGraphicsItemEffectSourcePrivate(this);
        QGraphicsEffectSource *source = new QGraphicsEffectSource(*sourced);
        d_ptr->graphicsEffect = effect;
        effect->d_func()->setGraphicsEffectSource(source);
        prepareGeometryChange();
    }
}